

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrReferenceSpaceType value)

{
  pointer pbVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  string vuid;
  string error_str;
  string local_d8;
  string local_b8;
  string *local_98;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_90;
  string *local_88;
  GenValidUsageXrInstanceInfo *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if ((int)value < 0x3b9b5e70) {
    if (value - XR_REFERENCE_SPACE_TYPE_VIEW < 3) {
      return true;
    }
  }
  else {
    local_98 = command_name;
    local_90 = objects_info;
    local_88 = item_name;
    local_80 = instance_info;
    if ((int)value < 0x3b9ce8f8) {
      if (value == XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT) {
        if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
          return true;
        }
        pbVar4 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pbVar4 != pbVar1;
        if (bVar5) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          while (iVar3 != 0) {
            pbVar4 = pbVar4 + 1;
            bVar5 = pbVar4 != pbVar1;
            if (pbVar4 == pbVar1) break;
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          }
        }
        pGVar2 = local_80;
        if (bVar5) {
          return true;
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"VUID-","");
        std::__cxx11::string::_M_append
                  ((char *)&local_d8,(ulong)(validation_name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_d8);
        std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_88->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_d8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT\"","");
        std::__cxx11::string::append((char *)&local_b8);
        std::__cxx11::string::append((char *)&local_b8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_48,local_90);
        CoreValidLogMessage(pGVar2,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_98,&local_48,
                            &local_b8);
        local_60.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_48.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_60.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_48.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        if (value != XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO) {
          return false;
        }
        if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
          return true;
        }
        pbVar4 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pbVar4 != pbVar1;
        if (bVar5) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          while (iVar3 != 0) {
            pbVar4 = pbVar4 + 1;
            bVar5 = pbVar4 != pbVar1;
            if (pbVar4 == pbVar1) break;
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          }
        }
        pGVar2 = local_80;
        if (bVar5) {
          return true;
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"VUID-","");
        std::__cxx11::string::_M_append
                  ((char *)&local_d8,(ulong)(validation_name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_d8);
        std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_88->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_d8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO\"","");
        std::__cxx11::string::append((char *)&local_b8);
        std::__cxx11::string::append((char *)&local_b8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_60,local_90);
        CoreValidLogMessage(pGVar2,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_98,&local_60,
                            &local_b8);
      }
    }
    else {
      if (value != XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML) {
        if (value != XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR) {
          return false;
        }
        return true;
      }
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      pbVar4 = (instance_info->enabled_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (instance_info->enabled_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = pbVar4 != pbVar1;
      if (bVar5) {
        iVar3 = std::__cxx11::string::compare((char *)pbVar4);
        while (iVar3 != 0) {
          pbVar4 = pbVar4 + 1;
          bVar5 = pbVar4 != pbVar1;
          if (pbVar4 == pbVar1) break;
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
        }
      }
      pGVar2 = local_80;
      if (bVar5) {
        return true;
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(validation_name->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_88->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML\"","");
      std::__cxx11::string::append((char *)&local_b8);
      std::__cxx11::string::append((char *)&local_b8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_78,local_90);
      CoreValidLogMessage(pGVar2,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_98,&local_78,
                          &local_b8);
      local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_78.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if (local_60.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrReferenceSpaceType value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    switch (value) {
        case XR_REFERENCE_SPACE_TYPE_VIEW:
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCAL:
            return true;
        case XR_REFERENCE_SPACE_TYPE_STAGE:
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR:
            return true;
        case XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT:
            // Enum value XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT requires extension XR_MSFT_unbounded_reference_space, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_unbounded_reference_space")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_unbounded_reference_space\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO:
            // Enum value XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO requires extension XR_VARJO_foveated_rendering, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_VARJO_foveated_rendering")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_VARJO_foveated_rendering\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML:
            // Enum value XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML requires extension XR_ML_localization_map, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_localization_map")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_ML_localization_map\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}